

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQObject __thiscall SQFuncState::CreateTable(SQFuncState *this)

{
  SQTable *x;
  SQObject SVar1;
  SQObjectPtr nt;
  SQObjectPtr local_30;
  SQObjectPtr local_20;
  
  x = SQTable::Create(this->_sharedstate,0);
  SQObjectPtr::SQObjectPtr(&local_20,x);
  local_30.super_SQObject._type = OT_INTEGER;
  local_30.super_SQObject._unVal.nInteger = 1;
  SQTable::NewSlot((this->_strings).super_SQObject._unVal.pTable,&local_20,&local_30);
  SQObjectPtr::~SQObjectPtr(&local_30);
  SQObjectPtr::~SQObjectPtr(&local_20);
  SVar1._4_4_ = 0;
  SVar1._type = local_20.super_SQObject._type;
  SVar1._unVal.pTable = local_20.super_SQObject._unVal.pTable;
  return SVar1;
}

Assistant:

SQObject SQFuncState::CreateTable()
{
    SQObjectPtr nt(SQTable::Create(_sharedstate,0));
    _table(_strings)->NewSlot(nt,(SQInteger)1);
    return nt;
}